

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int *in_RSI;
  uint32_t *unaff_retaddr;
  int support;
  uint32_t in_stack_0000029c;
  size_t in_stack_000002a0;
  uint32_t *in_stack_000002a8;
  size_t in_stack_000002b0;
  uint64_t *in_stack_000002b8;
  uint32_t in_stack_000006ac;
  size_t in_stack_000006b0;
  uint32_t *in_stack_000006b8;
  size_t in_stack_000006c0;
  uint64_t *in_stack_000006c8;
  uint32_t in_stack_fffffffffffffffc;
  
  uVar1 = croaring_hardware_support();
  if (((uVar1 & 2) == 0) || (*in_RSI < 0x2000)) {
    if (((uVar1 & 1) == 0) || (*in_RSI < 0x2000)) {
      sVar3 = bitset_extract_setbits
                        ((uint64_t *)bc,CONCAT44(base,support),unaff_retaddr,
                         in_stack_fffffffffffffffc);
      iVar2 = (int)sVar3;
    }
    else {
      sVar3 = bitset_extract_setbits_avx2
                        (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                         in_stack_0000029c);
      iVar2 = (int)sVar3;
    }
  }
  else {
    sVar3 = bitset_extract_setbits_avx512
                      (in_stack_000006c8,in_stack_000006c0,in_stack_000006b8,in_stack_000006b0,
                       in_stack_000006ac);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#if CROARING_IS_X64
   int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
   if(( support & ROARING_SUPPORTS_AVX512 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx512(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
   else
#endif
   if(( support & ROARING_SUPPORTS_AVX2 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}